

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DatatypeValidator::cleanUp(DatatypeValidator *this)

{
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *this_00;
  void *in_RSI;
  DatatypeValidator *this_local;
  
  this_00 = this->fFacets;
  if (this_00 != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::~RefHashTableOf(this_00);
    XMemory::operator_delete((XMemory *)this_00,in_RSI);
  }
  if (this->fRegex != (RegularExpression *)0x0) {
    (*this->fRegex->_vptr_RegularExpression[1])();
  }
  if (this->fPattern != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPattern);
  }
  if (this->fTypeName != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fTypeName);
  }
  return;
}

Assistant:

void DatatypeValidator::cleanUp() {

	delete fFacets;
    delete fRegex;
    if (fPattern)
        fMemoryManager->deallocate(fPattern);//delete [] fPattern;
    if (fTypeName)
        fMemoryManager->deallocate(fTypeName);
}